

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transport_udp.cpp
# Opt level: O1

TransportUDPPtr __thiscall
miniros::TransportUDP::createOutgoing
          (TransportUDP *this,string *host,int port,int connection_id,int max_datagram_size)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  int iVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  TransportUDPPtr TVar4;
  TransportUDPPtr transport;
  TransportUDP *local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_60 [2];
  string local_50;
  int local_2c;
  
  local_68 = (TransportUDP *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<miniros::TransportUDP,std::allocator<miniros::TransportUDP>,miniros::PollSet*&,int&,int&>
            (a_Stack_60,&local_68,(allocator<miniros::TransportUDP> *)&local_50,
             (PollSet **)((long)&host[8].field_2 + 8),(int *)(host + 9),&local_2c);
  std::__shared_ptr<miniros::TransportUDP,(__gnu_cxx::_Lock_policy)2>::
  _M_enable_shared_from_this_with<miniros::TransportUDP,miniros::TransportUDP>
            ((__shared_ptr<miniros::TransportUDP,(__gnu_cxx::_Lock_policy)2> *)&local_68,local_68);
  iVar2 = connect(local_68,port,(sockaddr *)(ulong)(uint)connection_id,max_datagram_size);
  _Var1._M_pi = a_Stack_60[0]._M_pi;
  _Var3._M_pi = extraout_RDX;
  if ((char)iVar2 == '\0') {
    if (console::g_initialized == '\0') {
      console::initialize();
      _Var3._M_pi = extraout_RDX_01;
    }
    if (createOutgoing::loc.initialized_ == false) {
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"miniros.transport_udp","");
      console::initializeLogLocation(&createOutgoing::loc,&local_50,Error);
      _Var3._M_pi = extraout_RDX_02;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        _Var3._M_pi = extraout_RDX_03;
      }
    }
    if (createOutgoing::loc.level_ != Error) {
      console::setLogLocationLevel(&createOutgoing::loc,Error);
      console::checkLogLocationEnabled(&createOutgoing::loc);
      _Var3._M_pi = extraout_RDX_04;
    }
    if (createOutgoing::loc.logger_enabled_ == true) {
      console::print((FilterBase *)0x0,createOutgoing::loc.logger_,createOutgoing::loc.level_,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/transport/transport_udp.cpp"
                     ,0x2be,
                     "TransportUDPPtr miniros::TransportUDP::createOutgoing(std::string, int, int, int)"
                     ,"Failed to create outgoing connection");
      _Var3._M_pi = extraout_RDX_05;
    }
    (this->super_Transport)._vptr_Transport = (_func_int **)0x0;
    (this->super_Transport).super_enable_shared_from_this<miniros::Transport>._M_weak_this.
    super___weak_ptr<miniros::Transport,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  }
  else {
    (this->super_Transport).super_enable_shared_from_this<miniros::Transport>._M_weak_this.
    super___weak_ptr<miniros::Transport,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    a_Stack_60[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (this->super_Transport)._vptr_Transport = (_func_int **)local_68;
    (this->super_Transport).super_enable_shared_from_this<miniros::Transport>._M_weak_this.
    super___weak_ptr<miniros::Transport,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)_Var1._M_pi;
    local_68 = (TransportUDP *)0x0;
  }
  if ((element_type *)a_Stack_60[0]._M_pi != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_60[0]._M_pi);
    _Var3._M_pi = extraout_RDX_00;
  }
  TVar4.super___shared_ptr<miniros::TransportUDP,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var3._M_pi;
  TVar4.super___shared_ptr<miniros::TransportUDP,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (TransportUDPPtr)
         TVar4.super___shared_ptr<miniros::TransportUDP,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

TransportUDPPtr TransportUDP::createOutgoing(std::string host, int port, int connection_id, int max_datagram_size)
{
  MINIROS_ASSERT(is_server_);
  
  TransportUDPPtr transport(std::make_shared<TransportUDP>(poll_set_, flags_, max_datagram_size));
  if (!transport->connect(host, port, connection_id))
  {
    MINIROS_ERROR("Failed to create outgoing connection");
    return TransportUDPPtr();
  }
  return transport;

}